

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

Utest * __thiscall
TEST_TestHarness_c_checkSignedByte_TestShell::createTest
          (TEST_TestHarness_c_checkSignedByte_TestShell *this)

{
  TEST_TestHarness_c_checkSignedByte_Test *this_00;
  TEST_TestHarness_c_checkSignedByte_TestShell *this_local;
  
  this_00 = (TEST_TestHarness_c_checkSignedByte_Test *)
            operator_new(0x10,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestHarness_cTest.cpp"
                         ,0x1e7);
  TEST_TestHarness_c_checkSignedByte_Test::TEST_TestHarness_c_checkSignedByte_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(TestHarness_c, checkSignedByte)
{
    CHECK_EQUAL_C_SBYTE(-3, -3);
    fixture->setTestFunction(failSignedByteMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <-3>\n\tbut was  <-5>");
    fixture->assertPrintContains("arness_c");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}